

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

bool Imf_3_4::usesLongNames(Header *header)

{
  bool bVar1;
  int iVar2;
  Attribute *pAVar3;
  undefined4 extraout_var;
  const_iterator x;
  char *pcVar4;
  size_t sVar5;
  ConstIterator i_1;
  ChannelList *channels;
  ConstIterator i;
  const_iterator in_stack_ffffffffffffffc8;
  ConstIterator *in_stack_ffffffffffffffd0;
  
  Header::begin((Header *)in_stack_ffffffffffffffc8._M_node);
  while( true ) {
    Header::end((Header *)in_stack_ffffffffffffffc8._M_node);
    bVar1 = operator!=(in_stack_ffffffffffffffd0,(ConstIterator *)in_stack_ffffffffffffffc8._M_node)
    ;
    if (!bVar1) {
      Header::channels((Header *)0x206994);
      x._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffffc8._M_node);
      while( true ) {
        in_stack_ffffffffffffffc8._M_node =
             (_Base_ptr)ChannelList::end(in_stack_ffffffffffffffc8._M_node);
        bVar1 = operator!=((ConstIterator *)x._M_node,
                           (ConstIterator *)in_stack_ffffffffffffffc8._M_node);
        if (!bVar1) {
          return false;
        }
        pcVar4 = ChannelList::ConstIterator::name((ConstIterator *)0x2069d3);
        sVar5 = strlen(pcVar4);
        if (0x1f < sVar5) break;
        ChannelList::ConstIterator::operator++((ConstIterator *)x._M_node);
      }
      return true;
    }
    pcVar4 = Header::ConstIterator::name((ConstIterator *)0x206946);
    sVar5 = strlen(pcVar4);
    if (0x1f < sVar5) break;
    pAVar3 = Header::ConstIterator::attribute((ConstIterator *)0x20695e);
    iVar2 = (*pAVar3->_vptr_Attribute[2])();
    sVar5 = strlen((char *)CONCAT44(extraout_var,iVar2));
    if (0x1f < sVar5) {
      return true;
    }
    Header::ConstIterator::operator++(in_stack_ffffffffffffffd0);
  }
  return true;
}

Assistant:

bool
usesLongNames (const Header& header)
{
    //
    // If an OpenEXR file contains any attribute names, attribute type names
    // or channel names longer than 31 characters, then the file cannot be
    // read by older versions of the OpenEXR library (up to OpenEXR 1.6.1).
    // Before writing the file header, we check if the header contains
    // any names longer than 31 characters; if it does, then we set the
    // LONG_NAMES_FLAG in the file version number.  Older versions of the
    // OpenEXR library will refuse to read files that have the LONG_NAMES_FLAG
    // set.  Without the flag, older versions of the library would mis-
    // interpret the file as broken.
    //

    for (Header::ConstIterator i = header.begin (); i != header.end (); ++i)
    {
        if (strlen (i.name ()) >= 32 ||
            strlen (i.attribute ().typeName ()) >= 32)
            return true;
    }

    const ChannelList& channels = header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        if (strlen (i.name ()) >= 32) return true;
    }

    return false;
}